

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_top_n_sigma_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float *pfVar1;
  long *in_RSI;
  long in_RDI;
  double dVar2;
  size_t i_2;
  float std;
  size_t i_1;
  float acc;
  float mean;
  size_t i;
  float logits_sum;
  float max;
  llama_sampler_top_n_sigma *ctx;
  float local_58;
  float local_4c;
  ulong local_48;
  undefined4 in_stack_ffffffffffffffc0;
  ulong local_38;
  float local_30;
  ulong local_28;
  float local_20;
  float local_1c;
  
  pfVar1 = *(float **)(in_RDI + 8);
  local_1c = *(float *)(*in_RSI + 4);
  local_20 = 0.0;
  for (local_28 = 0; local_28 < (ulong)in_RSI[1]; local_28 = local_28 + 1) {
    if (local_1c < *(float *)(*in_RSI + local_28 * 0xc + 4)) {
      local_1c = *(float *)(*in_RSI + local_28 * 0xc + 4);
    }
    local_20 = *(float *)(*in_RSI + local_28 * 0xc + 4) + local_20;
  }
  local_4c = (float)(ulong)in_RSI[1];
  local_30 = 0.0;
  for (local_38 = 0; local_38 < (ulong)in_RSI[1]; local_38 = local_38 + 1) {
    dVar2 = pow((double)(*(float *)(*in_RSI + local_38 * 0xc + 4) - local_20 / local_4c),2.0);
    local_30 = (float)((double)local_30 + dVar2);
  }
  local_58 = (float)(ulong)in_RSI[1];
  dVar2 = sqrt((double)(local_30 / local_58));
  for (local_48 = 0; local_48 < (ulong)in_RSI[1]; local_48 = local_48 + 1) {
    if (*(float *)(*in_RSI + local_48 * 0xc + 4) < -*pfVar1 * (float)dVar2 + local_1c) {
      *(undefined4 *)(*in_RSI + local_48 * 0xc + 4) = 0xff800000;
    }
  }
  llama_sampler_softmax_impl
            ((llama_token_data_array *)CONCAT44((float)dVar2,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

static void llama_sampler_top_n_sigma_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_top_n_sigma *) smpl->ctx;

    // find max logit and calculate mean
    float max = cur_p->data[0].logit;
    float logits_sum = 0;
    for (size_t i = 0; i < cur_p->size; ++i) {
        if (cur_p->data[i].logit > max) {
            max = cur_p->data[i].logit;
        }
        logits_sum += cur_p->data[i].logit;
    }
    float mean = logits_sum/cur_p->size;

    // calculate standard deviation
    float acc = 0;
    for (size_t i = 0; i < cur_p->size; ++i) {
        acc += pow(cur_p->data[i].logit - mean, 2);
    }
    float std = sqrt(acc/cur_p->size);

    //apply mask
    for (size_t i = 0; i < cur_p->size; ++i) {
        if (cur_p->data[i].logit < max - (ctx->n * std)) {
            cur_p->data[i].logit = -INFINITY;
        }
    }
    llama_sampler_softmax_impl(cur_p);
}